

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constpool.cpp
# Opt level: O0

void __thiscall asmjit::v1_14::ConstPool::fill(ConstPool *this,void *dst)

{
  uint8_t *in_RSI;
  long in_RDI;
  size_t i;
  ConstPoolFill filler;
  ConstPoolFill *in_stack_000001d0;
  Tree *in_stack_000001d8;
  ulong local_28;
  ConstPoolFill local_20;
  uint8_t *local_10;
  
  local_10 = in_RSI;
  memset(in_RSI,0,*(size_t *)(in_RDI + 0xf0));
  ConstPoolFill::ConstPoolFill(&local_20,local_10,1);
  for (local_28 = 0; local_28 < 7; local_28 = local_28 + 1) {
    Tree::forEach<asmjit::v1_14::ConstPoolFill>(in_stack_000001d8,in_stack_000001d0);
    local_20._dataSize = local_20._dataSize << 1;
  }
  return;
}

Assistant:

void ConstPool::fill(void* dst) const noexcept {
  // Clears possible gaps, asmjit should never emit garbage to the output.
  memset(dst, 0, _size);

  ConstPoolFill filler(static_cast<uint8_t*>(dst), 1);
  for (size_t i = 0; i < ASMJIT_ARRAY_SIZE(_tree); i++) {
    _tree[i].forEach(filler);
    filler._dataSize <<= 1;
  }
}